

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_write_impl_va(char *name,size_t line,char *func,char *file,log_level_id level,char *message,
                     ...)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  log_level_id in_R8D;
  undefined8 in_R9;
  log_record_va_list_type variable_args;
  log_level_id impl_level;
  int result;
  log_record_ctor_type record_ctor;
  log_impl impl;
  undefined1 auStackY_148 [8];
  char *in_stack_fffffffffffffec0;
  log_record_ctor in_stack_fffffffffffffed0;
  log_impl in_stack_fffffffffffffed8;
  undefined4 local_90;
  undefined4 local_8c;
  undefined1 *local_88;
  undefined1 *local_80;
  log_level_id local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  log_level_id local_58;
  undefined8 local_50;
  undefined4 *local_48;
  log_impl local_40;
  undefined8 local_38;
  log_level_id local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = log_singleton_get(in_stack_fffffffffffffec0);
  if (local_40 == (log_impl)0x0) {
    local_4 = 0;
  }
  else {
    local_78 = log_impl_level(local_40);
    if (local_40 == (log_impl)0x0) {
      local_4 = 1;
    }
    else if (local_2c < local_78) {
      local_4 = 0;
    }
    else {
      local_88 = &stack0x00000008;
      local_8c = 0x30;
      local_90 = 0x30;
      local_70 = local_18;
      local_68 = local_20;
      local_60 = local_28;
      local_58 = local_2c;
      local_50 = local_38;
      local_48 = &local_90;
      local_80 = auStackY_148;
      local_4 = log_impl_write(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    }
  }
  return local_4;
}

Assistant:

int log_write_impl_va(const char *name, const size_t line, const char *func, const char *file, const enum log_level_id level, const char *message, ...)
{
	log_impl impl = log_singleton_get(name);

	struct log_record_ctor_type record_ctor;

	int result;

	enum log_level_id impl_level;

	struct log_record_va_list_type variable_args;

	if (impl == NULL)
	{
		return 0;
	}

	impl_level = log_impl_level(impl);

	if (impl == NULL)
	{
		return 1;
	}

	if (level < impl_level)
	{
		return 0;
	}

	va_start(variable_args.data, message);

	record_ctor.line = line;
	record_ctor.func = func;
	record_ctor.file = file;
	record_ctor.level = level;
	record_ctor.message = message;
	record_ctor.variable_args = &variable_args;

	result = log_impl_write(impl, &record_ctor);

	va_end(variable_args.data);

	return result;
}